

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O1

int cvLsSolve(CVodeMem cv_mem,N_Vector b,N_Vector weight,N_Vector ynow,N_Vector fnow)

{
  double dVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *msgfmt;
  uint uVar6;
  realtype rVar7;
  int curiter;
  realtype local_40;
  int local_34;
  
  piVar2 = (int *)cv_mem->cv_lmem;
  if (piVar2 == (int *)0x0) {
    cvProcessError(cv_mem,-2,"CVLS","cvLsSolve","Linear solver memory is NULL.");
    return -2;
  }
  SUNNonlinSolGetCurIter(cv_mem->NLS,&local_34);
  if (*piVar2 == 0) {
    local_40 = 0.0;
  }
  else {
    local_40 = *(double *)(piVar2 + 0xe) * cv_mem->cv_tq[4];
    rVar7 = N_VWrmsNorm(b,weight);
    if (rVar7 <= local_40) {
      if (0 < local_34) {
        N_VConst(0.0,b);
      }
      piVar2[0x4c] = 0;
      return 0;
    }
    local_40 = local_40 * *(double *)(piVar2 + 0x10);
  }
  *(N_Vector *)(piVar2 + 0x1c) = ynow;
  *(N_Vector *)(piVar2 + 0x1e) = fnow;
  if ((*(SUNLinearSolver *)(piVar2 + 0x12))->ops->setscalingvectors ==
      (_func_int_SUNLinearSolver_N_Vector_N_Vector *)0x0) {
    if (*piVar2 != 0) {
      N_VConst(1.0,*(N_Vector *)(piVar2 + 0x1a));
      rVar7 = N_VWrmsNorm(weight,*(N_Vector *)(piVar2 + 0x1a));
      local_40 = local_40 / rVar7;
    }
  }
  else {
    iVar3 = SUNLinSolSetScalingVectors(*(SUNLinearSolver *)(piVar2 + 0x12),weight,weight);
    if (iVar3 != 0) {
      cvProcessError(cv_mem,-9,"CVLS","cvLsSolve","Error in calling SUNLinSolSetScalingVectors");
      piVar2[0x4c] = -9;
      return -9;
    }
  }
  N_VConst(0.0,*(N_Vector *)(piVar2 + 0x1a));
  iVar3 = SUNLinSolSetZeroGuess(*(SUNLinearSolver *)(piVar2 + 0x12),1);
  if (iVar3 != 0) {
    return -1;
  }
  if (*(code **)(piVar2 + 0x3e) != (code *)0x0) {
    iVar3 = (**(code **)(piVar2 + 0x3e))(cv_mem->cv_tn,ynow,fnow,*(undefined8 *)(piVar2 + 0x44));
    piVar2[0x4c] = iVar3;
    *(long *)(piVar2 + 0x30) = *(long *)(piVar2 + 0x30) + 1;
    if (iVar3 != 0) {
      cvProcessError(cv_mem,0,"CVLS","cvLsSolve",
                     "The Jacobian x vector setup routine failed in an unrecoverable manner.");
      return piVar2[0x4c];
    }
  }
  iVar3 = SUNLinSolSolve(*(SUNLinearSolver *)(piVar2 + 0x12),*(SUNMatrix *)(piVar2 + 0x14),
                         *(N_Vector *)(piVar2 + 0x1a),b,local_40);
  N_VScale(1.0,*(N_Vector *)(piVar2 + 0x1a),b);
  if (piVar2[0xc] != 0) {
    dVar1 = cv_mem->cv_gamrat;
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      N_VScale(2.0 / (dVar1 + 1.0),b,b);
    }
  }
  if ((*piVar2 == 0) ||
     ((*(SUNLinearSolver *)(piVar2 + 0x12))->ops->numiters == (_func_int_SUNLinearSolver *)0x0)) {
    lVar5 = 0;
  }
  else {
    iVar4 = SUNLinSolNumIters(*(SUNLinearSolver *)(piVar2 + 0x12));
    lVar5 = (long)iVar4;
  }
  *(long *)(piVar2 + 0x2a) = *(long *)(piVar2 + 0x2a) + lVar5;
  if (iVar3 != 0) {
    *(long *)(piVar2 + 0x2e) = *(long *)(piVar2 + 0x2e) + 1;
  }
  piVar2[0x4c] = iVar3;
  switch(iVar3) {
  case -0x32b:
  case -0x32a:
  case -0x323:
  case -0x322:
  case -0x321:
    goto switchD_00518182_caseD_fffffcd9;
  case -0x329:
    msgfmt = "Failure in SUNLinSol external package";
    iVar3 = -0x329;
    break;
  case -0x328:
    msgfmt = "The preconditioner solve routine failed in an unrecoverable manner.";
    iVar3 = -0x328;
    break;
  case -0x327:
  case -0x326:
  case -0x324:
    return 0;
  case -0x325:
    msgfmt = "The Jacobian x vector routine failed in an unrecoverable manner.";
    iVar3 = -0x325;
    break;
  default:
    uVar6 = iVar3 - 0x321;
    if (7 < uVar6) {
      return 0;
    }
    if ((0xf6U >> (uVar6 & 0x1f) & 1) == 0) {
      if (uVar6 == 0) {
        return (uint)(local_34 != 0);
      }
      return 0;
    }
    return 1;
  }
  cvProcessError(cv_mem,iVar3,"CVLS","cvLsSolve",msgfmt);
switchD_00518182_caseD_fffffcd9:
  return -1;
}

Assistant:

int cvLsSolve(CVodeMem cv_mem, N_Vector b, N_Vector weight,
              N_Vector ynow, N_Vector fnow)
{
  CVLsMem  cvls_mem;
  realtype bnorm, deltar, delta, w_mean;
  int      curiter, nli_inc, retval;
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  realtype resnorm;
  long int nps_inc;
#endif


  /* access CVLsMem structure */
  if (cv_mem->cv_lmem==NULL) {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, "CVLS",
                   "cvLsSolve", MSG_LS_LMEM_NULL);
    return(CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem) cv_mem->cv_lmem;

  /* get current nonlinear solver iteration */
  retval = SUNNonlinSolGetCurIter(cv_mem->NLS, &curiter);

  /* If the linear solver is iterative:
     test norm(b), if small, return x = 0 or x = b;
     set linear solver tolerance (in left/right scaled 2-norm) */
  if (cvls_mem->iterative) {
    deltar = cvls_mem->eplifac * cv_mem->cv_tq[4];
    bnorm = N_VWrmsNorm(b, weight);
    if (bnorm <= deltar) {
      if (curiter > 0) N_VConst(ZERO, b);
      cvls_mem->last_flag = CVLS_SUCCESS;
      return(cvls_mem->last_flag);
    }
    /* Adjust tolerance for 2-norm */
    delta = deltar * cvls_mem->nrmfac;
  } else {
    delta = ZERO;
  }

  /* Set vectors ycur and fcur for use by the Atimes and Psolve
     interface routines */
  cvls_mem->ycur = ynow;
  cvls_mem->fcur = fnow;

  /* Set scaling vectors for LS to use (if applicable) */
  if (cvls_mem->LS->ops->setscalingvectors) {
    retval = SUNLinSolSetScalingVectors(cvls_mem->LS,
                                        weight,
                                        weight);
    if (retval != SUNLS_SUCCESS) {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, "CVLS", "cvLsSolve",
                     "Error in calling SUNLinSolSetScalingVectors");
      cvls_mem->last_flag = CVLS_SUNLS_FAIL;
      return(cvls_mem->last_flag);
    }

  /* If solver is iterative and does not support scaling vectors, update the
     tolerance in an attempt to account for weight vector.  We make the
     following assumptions:
       1. w_i = w_mean, for i=0,...,n-1 (i.e. the weights are homogeneous)
       2. the linear solver uses a basic 2-norm to measure convergence
     Hence (using the notation from sunlinsol_spgmr.h, with S = diag(w)),
           || bbar - Abar xbar ||_2 < tol
       <=> || S b - S A x ||_2 < tol
       <=> || S (b - A x) ||_2 < tol
       <=> \sum_{i=0}^{n-1} (w_i (b - A x)_i)^2 < tol^2
       <=> w_mean^2 \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2
       <=> \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2 / w_mean^2
       <=> || b - A x ||_2 < tol / w_mean
     So we compute w_mean = ||w||_RMS = ||w||_2 and scale the desired tolerance accordingly. */
  } else if (cvls_mem->iterative) {

    N_VConst(ONE, cvls_mem->x);
    w_mean = N_VWrmsNorm(weight, cvls_mem->x);
    delta /= w_mean;

  }

  /* Set initial guess x = 0 to LS */
  N_VConst(ZERO, cvls_mem->x);

  /* Set zero initial guess flag */
  retval = SUNLinSolSetZeroGuess(cvls_mem->LS, SUNTRUE);
  if (retval != SUNLS_SUCCESS) return(-1);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  /* Store previous nps value in nps_inc */
  nps_inc = cvls_mem->nps;
#endif
  /* If a user-provided jtsetup routine is supplied, call that here */
  if (cvls_mem->jtsetup) {
    cvls_mem->last_flag = cvls_mem->jtsetup(cv_mem->cv_tn, ynow, fnow,
                                            cvls_mem->jt_data);
    cvls_mem->njtsetup++;
    if (cvls_mem->last_flag != 0) {
      cvProcessError(cv_mem, retval, "CVLS",
                     "cvLsSolve", MSG_LS_JTSETUP_FAILED);
      return(cvls_mem->last_flag);
    }
  }

  /* Call solver, and copy x to b */
  retval = SUNLinSolSolve(cvls_mem->LS, cvls_mem->A, cvls_mem->x, b, delta);
  N_VScale(ONE, cvls_mem->x, b);

  /* If using a direct or matrix-iterative solver, BDF method, and gamma has changed,
     scale the correction to account for change in gamma */
  if (cvls_mem->scalesol && cv_mem->cv_gamrat != ONE)
    N_VScale(TWO/(ONE + cv_mem->cv_gamrat), b, b);

  /* Retrieve statistics from iterative linear solvers */
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  resnorm = ZERO;
#endif
  nli_inc = 0;
  if (cvls_mem->iterative) {
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    if (cvls_mem->LS->ops->resnorm)
      resnorm = SUNLinSolResNorm(cvls_mem->LS);
#endif
    if (cvls_mem->LS->ops->numiters)
      nli_inc = SUNLinSolNumIters(cvls_mem->LS);
  }


  /* Increment counters nli and ncfl */
  cvls_mem->nli += nli_inc;
  if (retval != SUNLS_SUCCESS) cvls_mem->ncfl++;

  /* Interpret solver return value  */
  cvls_mem->last_flag = retval;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_INFO,
    "CVODE::cvLsSolve", "ls-stats",
    "bnorm = %.16g, resnorm = %.16g, ls_iters = %i, prec_solves = %i",
    bnorm, resnorm, nli_inc, (int)(cvls_mem->nps - nps_inc));
#endif

  switch(retval) {

  case SUNLS_SUCCESS:
    return(0);
    break;
  case SUNLS_RES_REDUCED:
    /* allow reduction but not solution on first Newton iteration,
       otherwise return with a recoverable failure */
    if (curiter == 0) return(0);
    else              return(1);
    break;
  case SUNLS_CONV_FAIL:
  case SUNLS_ATIMES_FAIL_REC:
  case SUNLS_PSOLVE_FAIL_REC:
  case SUNLS_PACKAGE_FAIL_REC:
  case SUNLS_QRFACT_FAIL:
  case SUNLS_LUFACT_FAIL:
    return(1);
    break;
  case SUNLS_MEM_NULL:
  case SUNLS_ILL_INPUT:
  case SUNLS_MEM_FAIL:
  case SUNLS_GS_FAIL:
  case SUNLS_QRSOL_FAIL:
    return(-1);
    break;
  case SUNLS_PACKAGE_FAIL_UNREC:
    cvProcessError(cv_mem, SUNLS_PACKAGE_FAIL_UNREC, "CVLS",
                   "cvLsSolve",
                    "Failure in SUNLinSol external package");
    return(-1);
    break;
  case SUNLS_ATIMES_FAIL_UNREC:
    cvProcessError(cv_mem, SUNLS_ATIMES_FAIL_UNREC, "CVLS",
                   "cvLsSolve", MSG_LS_JTIMES_FAILED);
    return(-1);
    break;
  case SUNLS_PSOLVE_FAIL_UNREC:
    cvProcessError(cv_mem, SUNLS_PSOLVE_FAIL_UNREC, "CVLS",
                   "cvLsSolve", MSG_LS_PSOLVE_FAILED);
    return(-1);
    break;
  }

  return(0);
}